

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ToolBar::setOrientation(ToolBar *this,Orientation orientation)

{
  ToolBarLayout *pTVar1;
  Orientation OVar2;
  ToolBarPrivate *pTVar3;
  NavigationArrow *pNVar4;
  QSizePolicy type;
  QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
  *this_00;
  undefined1 local_60 [16];
  undefined8 uStack_50;
  code *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  QSizePolicy local_28 [5];
  Orientation local_14;
  QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
  QStack_10;
  Orientation orientation_local;
  ToolBar *this_local;
  
  local_14 = orientation;
  QStack_10.d = (NavigationArrowPrivate *)this;
  pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
           ::operator->(&this->d);
  OVar2 = ToolBarLayout::orientation(pTVar3->layout);
  if (OVar2 != local_14) {
    QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>::
    operator->(&this->d);
    QObject::deleteLater();
    QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>::
    operator->(&this->d);
    QObject::deleteLater();
    type.field_0 = SUB84(this,0);
    if (local_14 == Vertical) {
      pNVar4 = (NavigationArrow *)operator_new(0x30);
      NavigationArrow::NavigationArrow(pNVar4,Top,&this->super_QWidget);
      pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
               ::operator->(&this->d);
      pTVar3->left = pNVar4;
      pNVar4 = (NavigationArrow *)operator_new(0x30);
      NavigationArrow::NavigationArrow(pNVar4,Bottom,&this->super_QWidget);
      pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
               ::operator->(&this->d);
      pTVar3->right = pNVar4;
      QSizePolicy::QSizePolicy(local_28,Fixed,Preferred,DefaultType);
      QWidget::setSizePolicy(type);
    }
    else {
      pNVar4 = (NavigationArrow *)operator_new(0x30);
      NavigationArrow::NavigationArrow(pNVar4,Left,&this->super_QWidget);
      pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
               ::operator->(&this->d);
      pTVar3->left = pNVar4;
      pNVar4 = (NavigationArrow *)operator_new(0x30);
      NavigationArrow::NavigationArrow(pNVar4,Right,&this->super_QWidget);
      pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
               ::operator->(&this->d);
      pTVar3->right = pNVar4;
      QSizePolicy::QSizePolicy((QSizePolicy *)(local_38 + 0xc),Preferred,Fixed,DefaultType);
      QWidget::setSizePolicy(type);
    }
    this_00 = &this->d;
    pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
             ::operator->(this_00);
    pTVar1 = pTVar3->layout;
    pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
             ::operator->(this_00);
    ToolBarLayout::setLeftArrow(pTVar1,pTVar3->left);
    pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
             ::operator->(this_00);
    pTVar1 = pTVar3->layout;
    pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
             ::operator->(this_00);
    ToolBarLayout::setRightArrow(pTVar1,pTVar3->right);
    pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
             ::operator->(this_00);
    local_48 = NavigationArrow::clicked;
    local_40 = 0;
    local_60._8_8_ = _q_leftArrowClicked;
    uStack_50 = 0;
    QObject::connect<void(QtMWidgets::NavigationArrow::*)(),void(QtMWidgets::ToolBar::*)()>
              ((Object *)local_38,(offset_in_NavigationArrow_to_subr)pTVar3->left,
               (Object *)NavigationArrow::clicked,0,(ConnectionType)type.field_0);
    QMetaObject::Connection::~Connection((Connection *)local_38);
    pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
             ::operator->(this_00);
    QObject::connect<void(QtMWidgets::NavigationArrow::*)(),void(QtMWidgets::ToolBar::*)()>
              ((Object *)local_60,(offset_in_NavigationArrow_to_subr)pTVar3->right,
               (Object *)NavigationArrow::clicked,0,(ConnectionType)type.field_0);
    QMetaObject::Connection::~Connection((Connection *)local_60);
    pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
             ::operator->(&this->d);
    ToolBarLayout::setOrientation(pTVar3->layout,local_14);
    QWidget::updateGeometry();
    orientationChanged(this,local_14);
  }
  return;
}

Assistant:

void
ToolBar::setOrientation( Qt::Orientation orientation )
{
	if( d->layout->orientation() != orientation )
	{
		d->left->deleteLater();
		d->right->deleteLater();

		if( orientation == Qt::Vertical )
		{
			d->left = new NavigationArrow( NavigationArrow::Top, this );
			d->right = new NavigationArrow( NavigationArrow::Bottom, this );

			setSizePolicy( QSizePolicy(
				QSizePolicy::Fixed, QSizePolicy::Preferred ) );
		}
		else
		{
			d->left = new NavigationArrow( NavigationArrow::Left, this );
			d->right = new NavigationArrow( NavigationArrow::Right, this );

			setSizePolicy( QSizePolicy(
				QSizePolicy::Preferred, QSizePolicy::Fixed ) );
		}

		d->layout->setLeftArrow( d->left );
		d->layout->setRightArrow( d->right );

		connect( d->left, &NavigationArrow::clicked,
			this, &ToolBar::_q_leftArrowClicked );

		connect( d->right, &NavigationArrow::clicked,
			this, &ToolBar::_q_rightArrowClicked );

		d->layout->setOrientation( orientation );

		updateGeometry();

		emit orientationChanged( orientation );
	}
}